

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void DoAccept<true>::Do(ResxData *data,cmSourceFile *f)

{
  string *this;
  string *psVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  string hFileName;
  string resx;
  cmSourceFile *f_local;
  ResxData *data_local;
  
  resx.field_2._8_8_ = f;
  psVar1 = cmSourceFile::GetFullPath(f,(string *)0x0);
  this = (string *)(hFileName.field_2._M_local_buf + 8);
  std::__cxx11::string::string(this,(string *)psVar1);
  std::__cxx11::string::find_last_of((char *)this,0xa6812e);
  std::__cxx11::string::substr((ulong)&local_78,(ulong)this);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 &local_78,".h");
  std::__cxx11::string::~string((string *)&local_78);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert(&data->ExpectedResxHeaders,(value_type *)local_58);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::push_back
            (&data->ResxSources,(value_type *)((long)&resx.field_2 + 8));
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(hFileName.field_2._M_local_buf + 8));
  return;
}

Assistant:

static void Do(cmGeneratorTarget::ResxData& data, cmSourceFile* f)
    {
    // Build and save the name of the corresponding .h file
    // This relationship will be used later when building the project files.
    // Both names would have been auto generated from Visual Studio
    // where the user supplied the file name and Visual Studio
    // appended the suffix.
    std::string resx = f->GetFullPath();
    std::string hFileName = resx.substr(0, resx.find_last_of(".")) + ".h";
    data.ExpectedResxHeaders.insert(hFileName);
    data.ResxSources.push_back(f);
    }